

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O1

void __thiscall OB::Term::ostream::streambuf::~streambuf(streambuf *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__streambuf_00112cf0;
  flush(this);
  pcVar2 = (this->_esc_seq)._M_dataplus._M_p;
  paVar1 = &(this->_esc_seq).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_buffer)._M_dataplus._M_p;
  paVar1 = &(this->_buffer).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->_prefix)._M_dataplus._M_p;
  paVar1 = &(this->_prefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  *(code **)this = std::ostream::flush;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

~streambuf()
    {
      flush();
    }